

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W_final.cpp
# Opt level: O0

energy_t __thiscall W_final::hfold(W_final *this,sparse_tree *tree)

{
  initializer_list<int> __l;
  value_type vVar1;
  bool bVar2;
  energy_t eVar3;
  reference pvVar4;
  reference pvVar5;
  int *piVar6;
  pointer piVar7;
  vector<Node,_std::allocator<Node>_> *in_RSI;
  s_energy_matrix *in_RDI;
  seq_interval *cur_interval;
  energy_t energy;
  energy_t acc;
  cand_pos_t k;
  energy_t m3;
  energy_t m2;
  energy_t m1;
  cand_pos_t j_1;
  bool pkonly;
  bool paired;
  bool restricted;
  pair_type ptype_closing;
  bool evaluate;
  int j;
  int i;
  sparse_tree *in_stack_00000130;
  seq_interval *in_stack_00000138;
  W_final *in_stack_00000140;
  vrna_param_t *in_stack_fffffffffffffef8;
  cand_pos_t in_stack_ffffffffffffff00;
  cand_pos_t in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  pseudo_loop *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  value_type local_cc;
  pointer in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  bool bVar8;
  vector<Node,_std::allocator<Node>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  energy_t in_stack_ffffffffffffff64;
  cand_pos_t in_stack_ffffffffffffff68;
  cand_pos_t in_stack_ffffffffffffff6c;
  paramT *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  cand_pos_t in_stack_ffffffffffffff80;
  value_type local_7c;
  int in_stack_ffffffffffffff88;
  int iVar9;
  vector<Node,_std::allocator<Node>_> *in_stack_ffffffffffffff90;
  int local_60;
  energy_t local_5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  cand_pos_t in_stack_ffffffffffffffb8;
  cand_pos_t in_stack_ffffffffffffffbc;
  cand_pos_t cVar10;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int iVar11;
  value_type local_38;
  int local_34;
  int local_28;
  int local_24;
  
  for (local_24 = *(int *)&(in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish; 0 < local_24; local_24 = local_24 + -1
      ) {
    for (local_28 = local_24;
        local_28 <=
        *(int *)&(in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish; local_28 = local_28 + 1) {
      bVar2 = sparse_tree::weakly_closed
                        ((sparse_tree *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                         (int)in_stack_ffffffffffffff20);
      iVar9 = pair[*(short *)((long)&((in_RDI->nodes).
                                      super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->energy +
                             (long)local_24 * 2)]
              [*(short *)((long)&((in_RDI->nodes).
                                  super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->energy +
                         (long)local_28 * 2)];
      pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RSI,(long)local_24);
      bVar8 = true;
      if (pvVar4->pair != -1) {
        pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RSI,(long)local_28);
        bVar8 = pvVar4->pair == -1;
      }
      in_stack_ffffffffffffff4f = bVar8;
      pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RSI,(long)local_24);
      in_stack_ffffffffffffff4e = false;
      if (pvVar4->pair == local_28) {
        pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RSI,(long)local_28);
        in_stack_ffffffffffffff4e = pvVar4->pair == local_24;
      }
      in_stack_ffffffffffffff4d = true;
      if (((ulong)in_RDI[1].params_ & 0x100) != 0) {
        in_stack_ffffffffffffff4d = in_stack_ffffffffffffff4e;
      }
      if ((((0 < (short)iVar9) && (bVar2)) && (bVar8 == false)) &&
         ((bool)in_stack_ffffffffffffff4d != false)) {
        s_energy_matrix::compute_energy_restricted
                  (in_RDI,CONCAT13(in_stack_ffffffffffffff4f,
                                   CONCAT12(in_stack_ffffffffffffff4e,
                                            CONCAT11(in_stack_ffffffffffffff4d,
                                                     in_stack_ffffffffffffff4c))),
                   in_stack_ffffffffffffff48,
                   (sparse_tree *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      }
      if (((ulong)in_RDI[1].params_ & 1) == 0) {
        pseudo_loop::compute_energies
                  (in_stack_ffffffffffffff20,(cand_pos_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                   (cand_pos_t)in_stack_ffffffffffffff18,
                   (sparse_tree *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      in_stack_ffffffffffffff38 =
           (in_RDI->WMv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      in_stack_ffffffffffffff44 = local_24;
      in_stack_ffffffffffffff48 = local_28;
      pseudo_loop::get_WMB
                ((pseudo_loop *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      s_energy_matrix::compute_WMv_WMp
                ((s_energy_matrix *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
      s_energy_matrix::compute_energy_WM_restricted
                ((s_energy_matrix *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                 (sparse_tree *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  for (local_34 = 4;
      local_34 <=
      *(int *)&(in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish; local_34 = local_34 + 1) {
    local_38 = 10000000;
    iVar11 = 10000000;
    pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RSI,(long)local_34);
    iVar9 = in_stack_ffffffffffffff88;
    if (pvVar4->pair < 0) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &(in_RDI->WMv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)(local_34 + -1));
      local_38 = *pvVar5;
      iVar9 = in_stack_ffffffffffffff88;
    }
    in_stack_ffffffffffffff88 = iVar11;
    for (cVar10 = 1; cVar10 <= local_34 + -4; cVar10 = cVar10 + 1) {
      if (cVar10 < 2) {
        local_cc = 0;
      }
      else {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &(in_RDI->WMv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(long)(cVar10 + -1));
        local_cc = *pvVar5;
      }
      s_energy_matrix::get_energy
                ((s_energy_matrix *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      s_energy_matrix::get_energy
                ((s_energy_matrix *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      s_energy_matrix::get_energy
                ((s_energy_matrix *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      local_5c = s_energy_matrix::get_energy
                           ((s_energy_matrix *)
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                            in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff00 = cVar10;
      in_stack_fffffffffffffef8 = in_RDI->params_;
      in_stack_ffffffffffffff08 = local_34;
      cVar10 = in_stack_ffffffffffffff00;
      E_ext_Stem((W_final *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (energy_t *)in_stack_ffffffffffffff58,(energy_t *)in_RDI,
                 (energy_t *)
                 CONCAT17(in_stack_ffffffffffffff4f,
                          CONCAT16(in_stack_ffffffffffffff4e,
                                   CONCAT15(in_stack_ffffffffffffff4d,
                                            CONCAT14(in_stack_ffffffffffffff4c,
                                                     in_stack_ffffffffffffff48)))),
                 (energy_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (short *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff70,
                 (cand_pos_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,iVar9,
                 in_stack_ffffffffffffff90);
      piVar6 = std::min<int>((int *)&stack0xffffffffffffffc4,(int *)&stack0xffffffffffffffb4);
      in_stack_ffffffffffffff88 = *piVar6;
      vVar1 = local_cc;
      if ((cVar10 == 1) ||
         ((bVar2 = sparse_tree::weakly_closed
                             ((sparse_tree *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                              (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                              (int)in_stack_ffffffffffffff20), bVar2 &&
          (bVar2 = sparse_tree::weakly_closed
                             ((sparse_tree *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                              (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                              (int)in_stack_ffffffffffffff20), vVar1 = local_cc, bVar2)))) {
        in_stack_ffffffffffffff2c = vVar1;
        eVar3 = pseudo_loop::get_WMB
                          ((pseudo_loop *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
        local_60 = in_stack_ffffffffffffff2c + eVar3 + PS_penalty;
        std::min<int>((int *)&stack0xffffffffffffffc0,&local_60);
      }
    }
    local_7c = local_38;
    in_stack_ffffffffffffff90 = (vector<Node,_std::allocator<Node>_> *)&local_7c;
    __l._M_len._0_4_ = in_stack_ffffffffffffff00;
    __l._M_array = &in_stack_fffffffffffffef8->id;
    __l._M_len._4_4_ = in_stack_ffffffffffffff04;
    in_stack_ffffffffffffff28 = std::min<int>(__l);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &(in_RDI->WMv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_34);
    *pvVar5 = in_stack_ffffffffffffff28;
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &(in_RDI->WMv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                      (long)*(int *)&(in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish);
  eVar3 = *pvVar5;
  piVar7 = (pointer)operator_new(0x18);
  (in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar7;
  *(in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_end_of_storage = 1;
  (in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[1] =
       *(int *)&(in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &(in_RDI->WMv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                      (long)*(int *)&(in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish);
  (in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[2] = *pvVar5;
  *(undefined1 *)
   ((in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage + 3) = 0x57;
  piVar7 = (in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  piVar7[4] = 0;
  piVar7[5] = 0;
  piVar7 = (in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  while (piVar7 != (pointer)0x0) {
    (in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         *(pointer *)
          ((in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4);
    backtrack_restricted(in_stack_00000140,in_stack_00000138,in_stack_00000130);
    if (piVar7 != (pointer)0x0) {
      operator_delete(piVar7,0x18);
    }
    piVar7 = (in_RDI->WMp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffff58,(ulong)&in_RDI->S_);
  std::__cxx11::string::operator=((string *)&in_RDI->S_,(string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  return eVar3;
}

Assistant:

energy_t W_final::hfold(sparse_tree &tree){

		for (int i = n; i >=1; --i)
		{	
			for (int j =i; j<=n; ++j)//for (i=0; i<=j; i++)
			{
				const bool evaluate = tree.weakly_closed(i,j);
				const pair_type ptype_closing = pair[S_[i]][S_[j]];
				const bool restricted = tree.tree[i].pair == -1 || tree.tree[j].pair == -1;
				const bool paired = (tree.tree[i].pair == j && tree.tree[j].pair == i);

				const bool pkonly = (!pk_only || paired);

				if(ptype_closing> 0 && evaluate && !restricted && pkonly)
				V->compute_energy_restricted (i,j,tree);

				if(!pk_free) WMB->compute_energies(i,j,tree);


				V->compute_WMv_WMp(i,j,WMB->get_WMB(i,j),tree.tree);
				V->compute_energy_WM_restricted(i,j,tree,WMB->WMB);
			}

		}

	for (cand_pos_t j= TURN+1; j <= n; j++){
		energy_t m1 = INF;
		energy_t m2 = INF;
		energy_t m3 = INF;
		if(tree.tree[j].pair < 0) m1 = W[j-1];
		
		
		for (cand_pos_t k=1; k<=j-TURN-1; ++k){
		 	// m2 = compute_W_br2_restricted (j, fres, must_choose_this_branch);
			energy_t acc = (k>1) ? W[k-1]: 0;
			m2 = std::min(m2,acc + E_ext_Stem(V->get_energy(k,j),V->get_energy(k+1,j),V->get_energy(k,j-1),V->get_energy(k+1,j-1),S_,params_,k,j,n,tree.tree));
			if (k == 1 || (tree.weakly_closed(1,k-1) && tree.weakly_closed(k,j))) m3 = std::min(m3,acc + WMB->get_WMB(k,j) + PS_penalty);
			}
		W[j] = std::min({m1,m2,m3});
	}

    energy_t energy = W[n];

    // backtrack
    // first add (1,n) on the stack
    stack_interval = new seq_interval;
    stack_interval->i = 1;
    stack_interval->j = n;
    stack_interval->energy = W[n];
    stack_interval->type = FREE;
    stack_interval->next = NULL;

    seq_interval *cur_interval = stack_interval;

    while ( cur_interval != NULL)
    {
        stack_interval = stack_interval->next;
        backtrack_restricted (cur_interval,tree);
        delete cur_interval;    // this should make up for the new in the insert_node
        cur_interval = stack_interval;
    }
	this->structure = structure.substr(1,n);
    return energy;

}